

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenBuffer.cpp
# Opt level: O1

shared_ptr<Token> __thiscall TokenBuffer::tokenAt(TokenBuffer *this,size_t i)

{
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  iterator __end1;
  shared_ptr<Token> sVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  _List_node_base *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  element_type *local_38;
  shared_ptr<Token> *token;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  _Var2._M_pi = in_RDX;
  local_38 = (element_type *)this;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(i + 0x10) <= in_RDX) {
    do {
      Tokenizer::currentToken(*(Tokenizer **)(i + 0x18));
      p_Var1 = (_List_node_base *)operator_new(0x20);
      p_Var3 = local_40;
      p_Var1[1]._M_next = local_48;
      p_Var1[1]._M_prev = (_List_node_base *)0x0;
      local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1[1]._M_prev = (_List_node_base *)p_Var3;
      local_48 = (_List_node_base *)0x0;
      std::__detail::_List_node_base::_M_hook(p_Var1);
      *(long *)(i + 0x10) = *(long *)(i + 0x10) + 1;
      if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
      }
      sVar5 = Tokenizer::nextToken((Tokenizer *)&stack0xffffffffffffffa8);
      _Var2 = sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
        _Var2._M_pi = extraout_RDX;
      }
    } while (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(i + 0x10) <= in_RDX);
  }
  (((_List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
   &(local_38->value)._M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next =
       (_List_node_base *)0x0;
  (local_38->value)._M_string_length = 0;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  plVar4 = (long *)i;
  do {
    plVar4 = (long *)*plVar4;
    if (plVar4 == (long *)i) {
LAB_00112bc8:
      sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
      sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
      return (shared_ptr<Token>)sVar5.super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (p_Var3 == in_RDX) {
      (((_List_base<std::shared_ptr<Token>,_std::allocator<std::shared_ptr<Token>_>_> *)
       &(local_38->value)._M_dataplus)->_M_impl)._M_node.super__List_node_base._M_next =
           (_List_node_base *)plVar4[2];
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_38->value)._M_string_length,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 3));
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_00112bc8;
    }
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&p_Var3->_vptr__Sp_counted_base + 1);
  } while( true );
}

Assistant:

const std::shared_ptr<Token> TokenBuffer::tokenAt(std::size_t i) noexcept {
  while (this->tokenList.size() <= i) {
    this->tokenList.push_back(this->tokenizer->currentToken());
    this->tokenizer->nextToken();
  }

  std::size_t numWalked = 0;
  std::shared_ptr<Token> token;

  for (const auto & it : this->tokenList) {
    if (numWalked == i) {
      token = it;
      break;
    }
    numWalked++;
  }

  return token;
}